

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_jpege_vepu1_v2.c
# Opt level: O2

MPP_RET hal_jpege_vepu1_start(void *hal,HalEncTask *task)

{
  RK_U32 RVar1;
  MPP_RET MVar2;
  MPP_RET MVar3;
  char *fmt;
  MppDevRegRdCfg rd_cfg;
  MppDevRegWrCfg wr_cfg;
  
  if (((byte)hal_jpege_debug & 1) != 0) {
    _mpp_log_l(4,"hal_jpege_vepu1","enter hal %p\n","hal_jpege_vepu1_start",hal);
  }
  hal_jpege_vepu1_set_extra_info(*hal,(JpegeSyntax *)((long)hal + 0x40),0);
  RVar1 = *(RK_U32 *)((long)hal + 0x28);
  wr_cfg.reg = *(void **)((long)hal + 0x18);
  wr_cfg.offset = 0;
  wr_cfg.size = RVar1;
  MVar2 = mpp_dev_ioctl(*hal,4,&wr_cfg);
  if (MVar2 == MPP_OK) {
    rd_cfg.reg = *(void **)((long)hal + 0x18);
    rd_cfg.offset = 0;
    rd_cfg.size = RVar1;
    MVar2 = mpp_dev_ioctl(*hal,5,&rd_cfg);
    if (MVar2 == MPP_OK) {
      MVar3 = mpp_dev_ioctl(*hal,0xf,(void *)0x0);
      MVar2 = MPP_OK;
      if (MVar3 != MPP_OK) {
        _mpp_log_l(2,"hal_jpege_vepu1","send cmd failed %d\n","hal_jpege_vepu1_start",
                   (ulong)(uint)MVar3);
        MVar2 = MVar3;
      }
      goto LAB_0023aec1;
    }
    fmt = "set register read failed %d\n";
  }
  else {
    fmt = "set register write failed %d\n";
  }
  _mpp_log_l(2,"hal_jpege_vepu1",fmt,"hal_jpege_vepu1_start",(ulong)(uint)MVar2);
LAB_0023aec1:
  if (((byte)hal_jpege_debug & 1) != 0) {
    _mpp_log_l(4,"hal_jpege_vepu1","leave hal %p\n","hal_jpege_vepu1_start",hal);
  }
  return MVar2;
}

Assistant:

static MPP_RET hal_jpege_vepu1_start(void *hal, HalEncTask *task)
{
    MPP_RET ret = MPP_OK;
    HalJpegeCtx *ctx = (HalJpegeCtx *)hal;

    hal_jpege_dbg_func("enter hal %p\n", hal);

    hal_jpege_vepu1_set_extra_info(ctx->dev, &ctx->syntax, 0);

    do {
        MppDevRegWrCfg wr_cfg;
        MppDevRegRdCfg rd_cfg;
        RK_U32 reg_size = ctx->reg_size;

        wr_cfg.reg = ctx->regs;
        wr_cfg.size = reg_size;
        wr_cfg.offset = 0;

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_WR, &wr_cfg);
        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }

        rd_cfg.reg = ctx->regs;
        rd_cfg.size = reg_size;
        rd_cfg.offset = 0;

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_RD, &rd_cfg);
        if (ret) {
            mpp_err_f("set register read failed %d\n", ret);
            break;
        }

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_CMD_SEND, NULL);
        if (ret) {
            mpp_err_f("send cmd failed %d\n", ret);
            break;
        }
    } while (0);

    hal_jpege_dbg_func("leave hal %p\n", hal);
    (void)task;
    return ret;
}